

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O2

void __thiscall dd::ProcessThreadImpl::ProcessThreadImpl(ProcessThreadImpl *this,char *thread_name)

{
  (this->super_ProcessThread).super_TaskQueueBase._vptr_TaskQueueBase =
       (_func_int **)&PTR_Delete_00137b28;
  Lock::Lock(&this->_lock);
  SequenceCheckerImpl::SequenceCheckerImpl((SequenceCheckerImpl *)&this->_thread_checker);
  Event::Event(&this->_wake_up);
  (this->_thread)._M_t.
  super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
  super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
  super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl = (PlatformThread *)0x0;
  (this->_modules).
  super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_modules;
  (this->_modules).
  super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_modules;
  (this->_modules).
  super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
  ._M_impl._M_node._M_size = 0;
  std::queue<dd::QueuedTask*,std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>>::
  queue<std::deque<dd::QueuedTask*,std::allocator<dd::QueuedTask*>>,void>(&this->_queue);
  (this->_delayed_tasks).c.
  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_delayed_tasks).c.
  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_delayed_tasks).c.
  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_stop = false;
  this->_thread_name = thread_name;
  return;
}

Assistant:

ProcessThreadImpl::ProcessThreadImpl(const char* thread_name)
		: _stop(false), _thread_name(thread_name) {}